

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ResetNotificationStrategy::RobustnessBase::createRobustContext
          (RobustnessBase *this,ResetNotificationStrategy reset)

{
  RenderContext *pRVar1;
  TestContext *this_00;
  CommandLine *pCVar2;
  Platform *platform;
  ContextType local_58;
  deUint32 local_54;
  ContextType local_50;
  undefined1 local_4c [8];
  RenderConfig renderCfg;
  ResetNotificationStrategy reset_local;
  RobustnessBase *this_local;
  
  renderCfg.numSamples = reset;
  unique0x100001af = this;
  pRVar1 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  local_58.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  local_54 = (deUint32)glu::ContextType::getAPI(&local_58);
  glu::ContextType::ContextType(&local_50,(ApiType)local_54,CONTEXT_ROBUST);
  glu::RenderConfig::RenderConfig((RenderConfig *)local_4c,local_50);
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pCVar2 = tcu::TestContext::getCommandLine(this_00);
  glu::parseRenderConfig((RenderConfig *)local_4c,pCVar2);
  renderCfg.stencilBits = renderCfg.numSamples;
  renderCfg.width = 3;
  platform = tcu::TestContext::getPlatform
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pCVar2 = tcu::TestContext::getCommandLine
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar1 = glu::createRenderContext(platform,pCVar2,(RenderConfig *)local_4c);
  this->m_robustContext = pRVar1;
  return;
}

Assistant:

void RobustnessBase::createRobustContext(glu::ResetNotificationStrategy reset)
{
	glu::RenderConfig renderCfg(glu::ContextType(m_context.getRenderContext().getType().getAPI(), glu::CONTEXT_ROBUST));

	glu::parseRenderConfig(&renderCfg, m_context.getTestContext().getCommandLine());

	renderCfg.resetNotificationStrategy = reset;
	renderCfg.surfaceType				= glu::RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC;

	m_robustContext = glu::createRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), renderCfg);
}